

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void reloadTableSchema(Parse *pParse,Table *pTab,char *zName)

{
  int p1;
  int p1_00;
  Vdbe *p;
  Trigger *pTVar1;
  char *pcVar2;
  
  p = sqlite3GetVdbe(pParse);
  if (p != (Vdbe *)0x0) {
    p1 = sqlite3SchemaToIndex(pParse->db,pTab->pSchema);
    for (pTVar1 = sqlite3TriggerList(pParse,pTab); pTVar1 != (Trigger *)0x0; pTVar1 = pTVar1->pNext)
    {
      p1_00 = sqlite3SchemaToIndex(pParse->db,pTVar1->pSchema);
      sqlite3VdbeAddOp4(p,0x6e,p1_00,0,0,pTVar1->zName,0);
    }
    sqlite3VdbeAddOp4(p,0x6c,p1,0,0,pTab->zName,0);
    pcVar2 = sqlite3MPrintf(pParse->db,"tbl_name=%Q",zName);
    if (pcVar2 != (char *)0x0) {
      sqlite3VdbeAddParseSchemaOp(p,p1,pcVar2);
      pcVar2 = whereTempTriggers(pParse,pTab);
      if (pcVar2 != (char *)0x0) {
        sqlite3VdbeAddParseSchemaOp(p,1,pcVar2);
        return;
      }
    }
  }
  return;
}

Assistant:

static void reloadTableSchema(Parse *pParse, Table *pTab, const char *zName){
  Vdbe *v;
  char *zWhere;
  int iDb;                   /* Index of database containing pTab */
#ifndef SQLITE_OMIT_TRIGGER
  Trigger *pTrig;
#endif

  v = sqlite3GetVdbe(pParse);
  if( NEVER(v==0) ) return;
  assert( sqlite3BtreeHoldsAllMutexes(pParse->db) );
  iDb = sqlite3SchemaToIndex(pParse->db, pTab->pSchema);
  assert( iDb>=0 );

#ifndef SQLITE_OMIT_TRIGGER
  /* Drop any table triggers from the internal schema. */
  for(pTrig=sqlite3TriggerList(pParse, pTab); pTrig; pTrig=pTrig->pNext){
    int iTrigDb = sqlite3SchemaToIndex(pParse->db, pTrig->pSchema);
    assert( iTrigDb==iDb || iTrigDb==1 );
    sqlite3VdbeAddOp4(v, OP_DropTrigger, iTrigDb, 0, 0, pTrig->zName, 0);
  }
#endif

  /* Drop the table and index from the internal schema.  */
  sqlite3VdbeAddOp4(v, OP_DropTable, iDb, 0, 0, pTab->zName, 0);

  /* Reload the table, index and permanent trigger schemas. */
  zWhere = sqlite3MPrintf(pParse->db, "tbl_name=%Q", zName);
  if( !zWhere ) return;
  sqlite3VdbeAddParseSchemaOp(v, iDb, zWhere);

#ifndef SQLITE_OMIT_TRIGGER
  /* Now, if the table is not stored in the temp database, reload any temp 
  ** triggers. Don't use IN(...) in case SQLITE_OMIT_SUBQUERY is defined. 
  */
  if( (zWhere=whereTempTriggers(pParse, pTab))!=0 ){
    sqlite3VdbeAddParseSchemaOp(v, 1, zWhere);
  }
#endif
}